

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

char * __thiscall kj::trimHeaderEnding(kj *this,ArrayPtr<char> content)

{
  kj *pkVar1;
  kj *pkVar2;
  char *pcVar3;
  
  pcVar3 = content.ptr;
  if (((char *)0x1 < pcVar3) && ((this + -1)[(long)pcVar3] == (kj)0xa)) {
    pkVar1 = this + (long)pcVar3;
    pkVar2 = this + (long)pcVar3 + -1;
    if (pkVar1[-2] == (kj)0xd) {
      pkVar2 = pkVar1 + -2;
    }
    pkVar1[~(ulong)(pkVar1[-2] == (kj)0xd)] = (kj)0x0;
    return (char *)pkVar2;
  }
  return (char *)0x0;
}

Assistant:

static char* trimHeaderEnding(kj::ArrayPtr<char> content) {
  // Trim off the trailing \r\n from a header blob.

  if (content.size() < 2) return nullptr;

  // Remove trailing \r\n\r\n and replace with \0 sentinel char.
  char* end = content.end();

  if (end[-1] != '\n') return nullptr;
  --end;
  if (end[-1] == '\r') --end;
  *end = '\0';

  return end;
}